

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall t_go_generator::generate_service(t_go_generator *this,t_service *tservice)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  ulong uVar4;
  string filename;
  string test_suffix;
  string f_service_name;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0 [8];
  undefined8 uStack_98;
  undefined1 *local_90;
  undefined1 local_80 [8];
  undefined8 uStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"_test","");
  pcVar1 = (this->super_t_generator).service_name_._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,
             pcVar1 + (this->super_t_generator).service_name_._M_string_length);
  if (local_a8 != 0) {
    uVar4 = 0;
    do {
      puVar2 = local_b0;
      iVar3 = tolower((int)(char)local_b0[uVar4]);
      puVar2[uVar4] = (char)iVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_a8);
  }
  if (local_b0 == local_a0) {
    uStack_78 = uStack_98;
    local_90 = local_80;
  }
  else {
    local_90 = local_b0;
  }
  local_a8 = 0;
  local_a0[0] = 0;
  local_48 = 0;
  local_40[0] = 0;
  local_b0 = local_a0;
  local_50 = local_40;
  generate_service_interface(this,tservice);
  generate_service_client(this,tservice);
  generate_service_server(this,tservice);
  generate_service_helpers(this,tservice);
  generate_service_remote(this,tservice);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->f_types_,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void t_go_generator::generate_service(t_service* tservice) {
  string test_suffix("_test");
  string filename = lowercase(service_name_);
  string f_service_name;

  generate_service_interface(tservice);
  generate_service_client(tservice);
  generate_service_server(tservice);
  generate_service_helpers(tservice);
  generate_service_remote(tservice);
  f_types_ << endl;
}